

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

_ __thiscall gjkepa2_impl::EPA::Evaluate(EPA *this,GJK *gjk,btVector3 *guess)

{
  btVector3 *this_00;
  sList *this_01;
  sSimplex *psVar1;
  bool bVar2;
  _ _Var3;
  sFace *psVar4;
  sFace *psVar5;
  sFace *psVar6;
  sFace *psVar7;
  sFace *face;
  sSV *psVar8;
  sSV *psVar9;
  EPA *this_02;
  sSV *psVar10;
  U pass;
  sFace *f;
  U j;
  ulong uVar11;
  ulong uVar12;
  btScalar bVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  btScalar bVar18;
  btScalar bVar19;
  btScalar bVar20;
  btScalar bVar21;
  btVector3 bVar22;
  btScalar nl;
  undefined1 auStack_d4 [12];
  sFace *psStack_d0;
  uint local_c8;
  EPA *local_b8;
  btVector3 local_b0;
  sSV *local_a0;
  sSV *local_98;
  EPA *local_90;
  sList *local_88;
  GJK *local_80;
  btVector3 local_78;
  btVector3 local_68;
  undefined1 local_58 [16];
  btScalar local_48;
  btScalar bStack_44;
  btScalar bStack_40;
  btScalar bStack_3c;
  
  psVar1 = gjk->m_simplex;
  if ((1 < psVar1->rank) && (local_80 = gjk, bVar2 = GJK::EncloseOrigin(gjk), bVar2)) {
    this_01 = &this->m_hull;
    while (psVar4 = this_01->root, psVar4 != (sFace *)0x0) {
      remove((EPA *)this_01,(char *)psVar4);
      append(&this->m_stock,psVar4);
    }
    this->m_status = Valid;
    this->m_nextsv = 0;
    local_88 = &this->m_stock;
    _nl = operator-(&psVar1->c[0]->w,&psVar1->c[3]->w);
    local_78 = operator-(&psVar1->c[1]->w,&psVar1->c[3]->w);
    local_b0 = operator-(&psVar1->c[2]->w,&psVar1->c[3]->w);
    bVar13 = GJK::det((btVector3 *)&nl,&local_78,&local_b0);
    psVar10 = psVar1->c[0];
    psVar9 = psVar1->c[1];
    psVar8 = psVar9;
    if (bVar13 < 0.0) {
      psVar1->c[0] = psVar9;
      psVar1->c[1] = psVar10;
      *(ulong *)psVar1->p =
           CONCAT44((int)*(undefined8 *)psVar1->p,(int)((ulong)*(undefined8 *)psVar1->p >> 0x20));
      psVar8 = psVar10;
      psVar10 = psVar9;
    }
    psVar4 = newface(this,psVar10,psVar8,psVar1->c[2],true);
    psVar5 = newface(this,psVar1->c[1],psVar1->c[0],psVar1->c[3],true);
    psVar6 = newface(this,psVar1->c[2],psVar1->c[1],psVar1->c[3],true);
    psVar7 = newface(this,psVar1->c[0],psVar1->c[2],psVar1->c[3],true);
    if ((this->m_hull).count == 4) {
      face = findbest(this);
      bVar18 = (face->n).m_floats[0];
      bVar19 = (face->n).m_floats[1];
      bVar20 = (face->n).m_floats[2];
      bVar21 = (face->n).m_floats[3];
      bVar13 = face->d;
      psVar10 = face->c[0];
      psVar9 = face->c[1];
      psVar8 = face->c[2];
      pass = 0;
      psVar4->e[0] = '\0';
      psVar4->f[0] = psVar5;
      psVar5->e[0] = '\0';
      psVar5->f[0] = psVar4;
      psVar4->e[1] = '\0';
      psVar4->f[1] = psVar6;
      psVar6->e[0] = '\x01';
      psVar6->f[0] = psVar4;
      psVar4->e[2] = '\0';
      psVar4->f[2] = psVar7;
      psVar7->e[0] = '\x02';
      psVar7->f[0] = psVar4;
      psVar5->e[1] = '\x02';
      psVar5->f[1] = psVar7;
      psVar7->e[2] = '\x01';
      psVar7->f[2] = psVar5;
      psVar5->e[2] = '\x01';
      psVar5->f[2] = psVar6;
      psVar6->e[1] = '\x02';
      psVar6->e[2] = '\x01';
      psVar6->f[1] = psVar5;
      psVar6->f[2] = psVar7;
      psVar7->e[1] = '\x02';
      psVar7->f[1] = psVar6;
      this->m_status = Valid;
      this_02 = this;
      local_b8 = this;
      local_90 = (EPA *)this_01;
      while (pass != 0xff) {
        uVar11 = (ulong)this_02->m_nextsv;
        if (0x3f < uVar11) {
          this_02->m_status = OutOfVertices;
          break;
        }
        local_58 = ZEXT416((uint)bVar13);
        local_c8 = 0;
        _nl = (btScalar  [4])ZEXT816(0);
        this_02->m_nextsv = this_02->m_nextsv + 1;
        pass = pass + 1;
        face->pass = (U1)pass;
        local_a0 = psVar8;
        local_98 = psVar10;
        local_48 = bVar18;
        bStack_44 = bVar19;
        bStack_40 = bVar20;
        bStack_3c = bVar21;
        GJK::getsupport(local_80,&face->n,this->m_sv_store + uVar11);
        bVar13 = btVector3::dot(&face->n,&this->m_sv_store[uVar11].w);
        this_02 = local_b8;
        if (bVar13 - face->d <= 0.0001) {
          _Var3 = AccuraryReached;
LAB_00163601:
          this_02->m_status = _Var3;
          psVar10 = local_98;
          psVar8 = local_a0;
          bVar18 = local_48;
          bVar19 = bStack_44;
          bVar20 = bStack_40;
          bVar21 = bStack_3c;
          bVar13 = (btScalar)local_58._0_4_;
          break;
        }
        bVar2 = true;
        uVar12 = 0;
        while ((uVar12 < 3 && (bVar2 != false))) {
          bVar2 = expand(this_02,pass,this->m_sv_store + uVar11,face->f[uVar12],
                         (uint)face->e[uVar12],(sHorizon *)&nl);
          uVar12 = uVar12 + 1;
        }
        if ((bVar2 & 2 < local_c8) == 0) {
          _Var3 = InvalidHull;
          goto LAB_00163601;
        }
        _nl->e[1] = '\x02';
        _nl->f[1] = psStack_d0;
        psStack_d0->e[2] = '\x01';
        psStack_d0->f[2] = _nl;
        remove(local_90,(char *)face);
        append(local_88,face);
        face = findbest(this_02);
        bVar18 = (face->n).m_floats[0];
        bVar19 = (face->n).m_floats[1];
        bVar20 = (face->n).m_floats[2];
        bVar21 = (face->n).m_floats[3];
        bVar13 = face->d;
        psVar10 = face->c[0];
        psVar9 = face->c[1];
        psVar8 = face->c[2];
      }
      unique0x100001c5 = bVar13 * bVar19;
      nl = bVar13 * bVar18;
      unique0x100001c9 = bVar20 * bVar13;
      unique0x100001cd = 0.0;
      (this_02->m_normal).m_floats[0] = bVar18;
      (this_02->m_normal).m_floats[1] = bVar19;
      (this_02->m_normal).m_floats[2] = bVar20;
      (this_02->m_normal).m_floats[3] = bVar21;
      this_02->m_depth = bVar13;
      (this_02->m_result).rank = 3;
      (this_02->m_result).c[0] = psVar10;
      (this_02->m_result).c[1] = psVar9;
      (this_02->m_result).c[2] = psVar8;
      local_b0 = operator-(&psVar9->w,(btVector3 *)&nl);
      local_68 = operator-(&psVar8->w,(btVector3 *)&nl);
      local_78 = btVector3::cross(&local_b0,&local_68);
      bVar13 = btVector3::length(&local_78);
      (this_02->m_result).p[0] = bVar13;
      local_b0 = operator-(&psVar8->w,(btVector3 *)&nl);
      local_68 = operator-(&psVar10->w,(btVector3 *)&nl);
      local_78 = btVector3::cross(&local_b0,&local_68);
      bVar13 = btVector3::length(&local_78);
      (this_02->m_result).p[1] = bVar13;
      local_b0 = operator-(&psVar10->w,(btVector3 *)&nl);
      local_68 = operator-(&psVar9->w,(btVector3 *)&nl);
      local_78 = btVector3::cross(&local_b0,&local_68);
      bVar13 = btVector3::length(&local_78);
      uVar11 = *(ulong *)(this_02->m_result).p;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar11;
      fVar16 = (float)(uVar11 >> 0x20);
      fVar17 = fVar16 + (float)uVar11 + bVar13;
      auVar15._4_4_ = fVar17;
      auVar15._0_4_ = fVar17;
      auVar15._8_4_ = fVar16;
      auVar15._12_4_ = fVar16;
      auVar15 = divps(auVar14,auVar15);
      *(long *)(this_02->m_result).p = auVar15._0_8_;
      (this_02->m_result).p[2] = bVar13 / fVar17;
      this = this_02;
      goto LAB_001635d8;
    }
  }
  this->m_status = FallBack;
  bVar22 = operator-(guess);
  this_00 = &this->m_normal;
  *&(this->m_normal).m_floats = bVar22.m_floats;
  bVar13 = btVector3::length(this_00);
  nl = bVar13;
  if (bVar13 <= 0.0) {
    this_00->m_floats[0] = 1.0;
    this_00->m_floats[1] = 0.0;
    (this->m_normal).m_floats[2] = 0.0;
    (this->m_normal).m_floats[3] = 0.0;
  }
  else {
    bVar22 = operator/(this_00,&nl);
    *&(this->m_normal).m_floats = bVar22.m_floats;
  }
  this->m_depth = 0.0;
  (this->m_result).rank = 1;
  (this->m_result).c[0] = psVar1->c[0];
  (this->m_result).p[0] = 1.0;
LAB_001635d8:
  return this->m_status;
}

Assistant:

eStatus::_			Evaluate(GJK& gjk,const btVector3& guess)
			{
				GJK::sSimplex&	simplex=*gjk.m_simplex;
				if((simplex.rank>1)&&gjk.EncloseOrigin())
				{

					/* Clean up				*/ 
					while(m_hull.root)
					{
						sFace*	f = m_hull.root;
						remove(m_hull,f);
						append(m_stock,f);
					}
					m_status	=	eStatus::Valid;
					m_nextsv	=	0;
					/* Orient simplex		*/ 
					if(gjk.det(	simplex.c[0]->w-simplex.c[3]->w,
						simplex.c[1]->w-simplex.c[3]->w,
						simplex.c[2]->w-simplex.c[3]->w)<0)
					{
						btSwap(simplex.c[0],simplex.c[1]);
						btSwap(simplex.p[0],simplex.p[1]);
					}
					/* Build initial hull	*/ 
					sFace*	tetra[]={newface(simplex.c[0],simplex.c[1],simplex.c[2],true),
						newface(simplex.c[1],simplex.c[0],simplex.c[3],true),
						newface(simplex.c[2],simplex.c[1],simplex.c[3],true),
						newface(simplex.c[0],simplex.c[2],simplex.c[3],true)};
					if(m_hull.count==4)
					{
						sFace*		best=findbest();
						sFace		outer=*best;
						U			pass=0;
						U			iterations=0;
						bind(tetra[0],0,tetra[1],0);
						bind(tetra[0],1,tetra[2],0);
						bind(tetra[0],2,tetra[3],0);
						bind(tetra[1],1,tetra[3],2);
						bind(tetra[1],2,tetra[2],1);
						bind(tetra[2],2,tetra[3],1);
						m_status=eStatus::Valid;
						for(;iterations<EPA_MAX_ITERATIONS;++iterations)
						{
							if(m_nextsv<EPA_MAX_VERTICES)
							{	
								sHorizon		horizon;
								sSV*			w=&m_sv_store[m_nextsv++];
								bool			valid=true;					
								best->pass	=	(U1)(++pass);
								gjk.getsupport(best->n,*w);
								const btScalar	wdist=btDot(best->n,w->w)-best->d;
								if(wdist>EPA_ACCURACY)
								{
									for(U j=0;(j<3)&&valid;++j)
									{
										valid&=expand(	pass,w,
											best->f[j],best->e[j],
											horizon);
									}
									if(valid&&(horizon.nf>=3))
									{
										bind(horizon.cf,1,horizon.ff,2);
										remove(m_hull,best);
										append(m_stock,best);
										best=findbest();
										outer=*best;
									} else { m_status=eStatus::InvalidHull;break; }
								} else { m_status=eStatus::AccuraryReached;break; }
							} else { m_status=eStatus::OutOfVertices;break; }
						}
						const btVector3	projection=outer.n*outer.d;
						m_normal	=	outer.n;
						m_depth		=	outer.d;
						m_result.rank	=	3;
						m_result.c[0]	=	outer.c[0];
						m_result.c[1]	=	outer.c[1];
						m_result.c[2]	=	outer.c[2];
						m_result.p[0]	=	btCross(	outer.c[1]->w-projection,
							outer.c[2]->w-projection).length();
						m_result.p[1]	=	btCross(	outer.c[2]->w-projection,
							outer.c[0]->w-projection).length();
						m_result.p[2]	=	btCross(	outer.c[0]->w-projection,
							outer.c[1]->w-projection).length();
						const btScalar	sum=m_result.p[0]+m_result.p[1]+m_result.p[2];
						m_result.p[0]	/=	sum;
						m_result.p[1]	/=	sum;
						m_result.p[2]	/=	sum;
						return(m_status);
					}
				}
				/* Fallback		*/ 
				m_status	=	eStatus::FallBack;
				m_normal	=	-guess;
				const btScalar	nl=m_normal.length();
				if(nl>0)
					m_normal	=	m_normal/nl;
				else
					m_normal	=	btVector3(1,0,0);
				m_depth	=	0;
				m_result.rank=1;
				m_result.c[0]=simplex.c[0];
				m_result.p[0]=1;	
				return(m_status);
			}